

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O3

void __thiscall Runner::HandleParamBlock(Runner *this,ParamBlock *block,bool isConfigs)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  undefined7 in_register_00000011;
  uint uVar6;
  uint uVar7;
  vector<int,_std::allocator<int>_> *this_00;
  char *pcVar8;
  ulong __new_size;
  ulong uVar9;
  
  uVar2 = block->numParams;
  uVar6 = (uint)(ushort)(block->startIdx << 8 | block->startIdx >> 8);
  __new_size = (ulong)((ushort)(uVar2 << 8 | uVar2 >> 8) + uVar6);
  if ((int)CONCAT71(in_register_00000011,isConfigs) == 0) {
    if (__new_size <=
        (ulong)((long)(this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2)) goto LAB_00128472;
    this_00 = &this->m_CurrStatuses;
  }
  else {
    if (__new_size <=
        (ulong)((long)(this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2)) goto LAB_00128472;
    this_00 = &this->m_CurrConfigs;
  }
  CLI::std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
LAB_00128472:
  if (s_JSONOutput == true) {
    pcVar8 = "\"status\": {";
    if (isConfigs) {
      pcVar8 = "\"config\": {";
    }
    puts(pcVar8);
  }
  if (uVar2 != 0) {
    p_Var1 = &(this->m_TemperatureStatusIndices)._M_t._M_impl.super__Rb_tree_header;
    bVar3 = false;
    uVar9 = (ulong)uVar6;
    do {
      uVar2 = *(ushort *)((long)block + (uVar9 - uVar6) * 2 + 4);
      if (uVar2 != 0x55aa) {
        uVar7 = (uint)(short)(uVar2 << 8 | uVar2 >> 8);
        if (isConfigs) {
          (this->m_CurrConfigs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = uVar7;
          if (s_JSONOutput == true) {
            if (bVar3) {
              puts(",");
            }
            printf("\"%d\" : %d",uVar9 & 0xffffffff,(ulong)uVar7);
            bVar3 = true;
          }
          else {
            pcVar8 = "/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n";
LAB_00128606:
            printf(pcVar8,uVar9 & 0xffffffff,uVar9 & 0xffffffff,(ulong)uVar7);
          }
        }
        else {
          (this->m_CurrStatuses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = uVar7;
          if (s_JSONOutput != true) {
            p_Var4 = (this->m_TemperatureStatusIndices)._M_t._M_impl.super__Rb_tree_header._M_header
                     ._M_parent;
            p_Var5 = &p_Var1->_M_header;
            if (p_Var4 != (_Base_ptr)0x0) {
              do {
                if ((long)uVar9 <= (long)(int)*(size_t *)(p_Var4 + 1)) {
                  p_Var5 = p_Var4;
                }
                p_Var4 = (&p_Var4->_M_left)[(long)(int)*(size_t *)(p_Var4 + 1) < (long)uVar9];
              } while (p_Var4 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
                 ((long)(int)((_Rb_tree_header *)p_Var5)->_M_node_count <= (long)uVar9)) {
                printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n"
                       ,(double)((float)(int)uVar7 / 10.0),uVar9 & 0xffffffff,uVar9 & 0xffffffff);
                goto LAB_00128619;
              }
            }
            pcVar8 = "/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n";
            goto LAB_00128606;
          }
          if (bVar3) {
            puts(",");
          }
          printf("\"%d\" : ",uVar9 & 0xffffffff);
          p_Var4 = (this->m_TemperatureStatusIndices)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent;
          p_Var5 = &p_Var1->_M_header;
          if (p_Var4 != (_Base_ptr)0x0) {
            do {
              if ((long)uVar9 <= (long)(int)*(size_t *)(p_Var4 + 1)) {
                p_Var5 = p_Var4;
              }
              p_Var4 = (&p_Var4->_M_left)[(long)(int)*(size_t *)(p_Var4 + 1) < (long)uVar9];
            } while (p_Var4 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
               ((long)(int)((_Rb_tree_header *)p_Var5)->_M_node_count <= (long)uVar9)) {
              bVar3 = true;
              printf("%.1f",(double)((float)(int)uVar7 / 10.0));
              goto LAB_00128619;
            }
          }
          printf("%d",(ulong)uVar7);
          bVar3 = true;
        }
      }
LAB_00128619:
      uVar9 = uVar9 + 1;
    } while (uVar9 < __new_size);
  }
  if (s_JSONOutput == false) {
    return;
  }
  printf("\n}");
  if (!isConfigs) {
    putchar(0x2c);
  }
  putchar(10);
  return;
}

Assistant:

void HandleParamBlock(ParamBlock* block, bool isConfigs)
	{
		int startIdx = ntohs(block->startIdx);
		int numParams = ntohs(block->numParams);
		if (isConfigs && numParams + startIdx > m_CurrConfigs.size())
			m_CurrConfigs.resize(numParams + startIdx);
		if (!isConfigs && numParams + startIdx > m_CurrStatuses.size())
			m_CurrStatuses.resize(numParams + startIdx);

		if(s_JSONOutput)
		{
			// Header
			if(isConfigs)
				printf("\"config\": {\n");
			else
				printf("\"status\": {\n");
		}

		bool hasPrev = false;
		for (int i = startIdx; i < startIdx + numParams; ++i)
		{
			int16_t valInt = ntohs(block->payload[i - startIdx]);
			if (valInt == -21931)
				continue;
			if(isConfigs)
			{
				m_CurrConfigs[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : %d", i, valInt);
					hasPrev = true;
				}
				else
				{
					printf("/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n",i, i, valInt);
				}
			}
			else
			{
				m_CurrStatuses[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : ", i);
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("%.1f", fval);
					}
					else
						printf("%d", valInt);
					
					hasPrev = true;


				}
				else
				{
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n", i, i, fval);
					}
					else
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n", i, i, valInt);
				}
			}
		}
		if(s_JSONOutput)
		{
			printf("\n}");
			if(!isConfigs) // Status is printed out first
				printf(",");
			printf("\n");
		}

	}